

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void goodform::json::stringify_array(any *v,ostream *output)

{
  vector<std::any,_std::allocator<std::any>_> *pvVar1;
  pointer v_00;
  
  std::operator<<(output,"[");
  pvVar1 = std::any_cast<std::vector<std::any,std::allocator<std::any>>const&>(v);
  v_00 = (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
         super__Vector_impl_data._M_start;
  while( true ) {
    pvVar1 = std::any_cast<std::vector<std::any,std::allocator<std::any>>const&>(v);
    if (v_00 == (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                super__Vector_impl_data._M_finish) break;
    pvVar1 = std::any_cast<std::vector<std::any,std::allocator<std::any>>const&>(v);
    if (v_00 != (pvVar1->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                super__Vector_impl_data._M_start) {
      std::operator<<(output,",");
    }
    serialize(v_00,output);
    v_00 = v_00 + 1;
  }
  std::operator<<(output,"]");
  return;
}

Assistant:

void json::stringify_array(const any& v, std::ostream& output)
  {
    output << "[";
    for (auto it = get<goodform::array_t>(v).begin(); it != get<goodform::array_t>(v).end(); ++it)
    {

      if (it != get<goodform::array_t>(v).begin())
        output << ",";
      serialize(*it, output);
    }
    output << "]";
  }